

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

gzFile gz_open(void *path,int fd,char *mode)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  uchar *puVar6;
  __off64_t _Var7;
  char *in_RDX;
  int in_ESI;
  char *in_RDI;
  int exclusive;
  int cloexec;
  int oflag;
  size_t len;
  gz_state *state;
  int local_54;
  uint local_50;
  char *local_20;
  gzFile local_8;
  
  bVar1 = false;
  bVar2 = false;
  if (in_RDI == (char *)0x0) {
    local_8 = (gzFile)0x0;
  }
  else {
    local_8 = (gzFile)zng_alloc(0x144292);
    if (local_8 == (gzFile)0x0) {
      local_8 = (gzFile)0x0;
    }
    else {
      *(undefined4 *)&local_8[1].pos = 0;
      *(undefined4 *)((long)&local_8[1].pos + 4) = 0x20000;
      *(undefined8 *)(local_8 + 5) = 0;
      local_8[1].have = 0;
      *(undefined4 *)&local_8[3].pos = 0xffffffff;
      *(undefined4 *)((long)&local_8[3].pos + 4) = 0;
      *(undefined4 *)&local_8[2].pos = 0;
      for (local_20 = in_RDX; *local_20 != '\0'; local_20 = local_20 + 1) {
        if ((*local_20 < '0') || ('9' < *local_20)) {
          switch(*local_20) {
          case '+':
            zng_free((void *)0x1443ac);
            return (gzFile)0x0;
          default:
            break;
          case 'F':
            *(undefined4 *)((long)&local_8[3].pos + 4) = 4;
            break;
          case 'R':
            *(undefined4 *)((long)&local_8[3].pos + 4) = 3;
            break;
          case 'T':
            *(undefined4 *)&local_8[2].pos = 1;
            break;
          case 'a':
            local_8[1].have = 1;
            break;
          case 'b':
            break;
          case 'e':
            bVar1 = true;
            break;
          case 'f':
            *(undefined4 *)((long)&local_8[3].pos + 4) = 1;
            break;
          case 'h':
            *(undefined4 *)((long)&local_8[3].pos + 4) = 2;
            break;
          case 'r':
            local_8[1].have = 0x1c4f;
            break;
          case 'w':
            local_8[1].have = 0x79b1;
            break;
          case 'x':
            bVar2 = true;
          }
        }
        else {
          *(int *)&local_8[3].pos = *local_20 + -0x30;
        }
      }
      if (local_8[1].have == 0) {
        zng_free((void *)0x144442);
        local_8 = (gzFile)0x0;
      }
      else {
        if (local_8[1].have == 0x1c4f) {
          if ((int)local_8[2].pos != 0) {
            zng_free((void *)0x144473);
            return (gzFile)0x0;
          }
          *(undefined4 *)&local_8[2].pos = 1;
        }
        sVar5 = strlen(in_RDI);
        puVar6 = (uchar *)malloc(sVar5 + 1);
        local_8[1].next = puVar6;
        if (local_8[1].next == (uchar *)0x0) {
          zng_free((void *)0x1444cc);
          local_8 = (gzFile)0x0;
        }
        else {
          snprintf((char *)local_8[1].next,sVar5 + 1,"%s",in_RDI);
          uVar3 = 0;
          if (bVar1) {
            uVar3 = 0x80000;
          }
          if (local_8[1].have == 0x1c4f) {
            local_50 = 0;
          }
          else {
            uVar4 = 0;
            if (bVar2) {
              uVar4 = 0x80;
            }
            local_50 = 0x400;
            if (local_8[1].have == 0x79b1) {
              local_50 = 0x200;
            }
            local_50 = uVar4 | 0x41 | local_50;
          }
          local_54 = in_ESI;
          if (in_ESI < 0) {
            local_54 = open(in_RDI,uVar3 | local_50,0x1b6);
          }
          *(int *)&local_8[1].field_0x4 = local_54;
          if (*(int *)&local_8[1].field_0x4 == -1) {
            free(local_8[1].next);
            zng_free((void *)0x1445c9);
            local_8 = (gzFile)0x0;
          }
          else {
            if (local_8[1].have == 1) {
              lseek64(*(int *)&local_8[1].field_0x4,0,2);
              local_8[1].have = 0x79b1;
            }
            if (local_8[1].have == 0x1c4f) {
              _Var7 = lseek64(*(int *)&local_8[1].field_0x4,0,1);
              *(__off64_t *)(local_8 + 3) = _Var7;
              if (*(long *)(local_8 + 3) == -1) {
                *(undefined8 *)(local_8 + 3) = 0;
              }
            }
            gz_reset((gz_state *)0x144659);
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

static gzFile gz_open(const void *path, int fd, const char *mode) {
    gz_state *state;
    size_t len;
    int oflag;
#ifdef O_CLOEXEC
    int cloexec = 0;
#endif
#ifdef O_EXCL
    int exclusive = 0;
#endif

    /* check input */
    if (path == NULL)
        return NULL;

    /* allocate gzFile structure to return */
    state = (gz_state *)zng_alloc(sizeof(gz_state));
    if (state == NULL)
        return NULL;
    state->size = 0;            /* no buffers allocated yet */
    state->want = GZBUFSIZE;    /* requested buffer size */
    state->msg = NULL;          /* no error message yet */

    /* interpret mode */
    state->mode = GZ_NONE;
    state->level = Z_DEFAULT_COMPRESSION;
    state->strategy = Z_DEFAULT_STRATEGY;
    state->direct = 0;
    while (*mode) {
        if (*mode >= '0' && *mode <= '9') {
            state->level = *mode - '0';
        } else {
            switch (*mode) {
            case 'r':
                state->mode = GZ_READ;
                break;
#ifndef NO_GZCOMPRESS
            case 'w':
                state->mode = GZ_WRITE;
                break;
            case 'a':
                state->mode = GZ_APPEND;
                break;
#endif
            case '+':       /* can't read and write at the same time */
                zng_free(state);
                return NULL;
            case 'b':       /* ignore -- will request binary anyway */
                break;
#ifdef O_CLOEXEC
            case 'e':
                cloexec = 1;
                break;
#endif
#ifdef O_EXCL
            case 'x':
                exclusive = 1;
                break;
#endif
            case 'f':
                state->strategy = Z_FILTERED;
                break;
            case 'h':
                state->strategy = Z_HUFFMAN_ONLY;
                break;
            case 'R':
                state->strategy = Z_RLE;
                break;
            case 'F':
                state->strategy = Z_FIXED;
                break;
            case 'T':
                state->direct = 1;
                break;
            default:        /* could consider as an error, but just ignore */
                {}
            }
        }
        mode++;
    }

    /* must provide an "r", "w", or "a" */
    if (state->mode == GZ_NONE) {
        zng_free(state);
        return NULL;
    }

    /* can't force transparent read */
    if (state->mode == GZ_READ) {
        if (state->direct) {
            zng_free(state);
            return NULL;
        }
        state->direct = 1;      /* for empty file */
    }

    /* save the path name for error messages */
#ifdef WIDECHAR
    if (fd == -2) {
        len = wcstombs(NULL, (const wchar_t *)path, 0);
        if (len == (size_t)-1)
            len = 0;
    } else
#endif
        len = strlen((const char *)path);
    state->path = (char *)malloc(len + 1);
    if (state->path == NULL) {
        zng_free(state);
        return NULL;
    }
#ifdef WIDECHAR
    if (fd == -2)
        if (len) {
            wcstombs(state->path, (const wchar_t *)path, len + 1);
        } else {
            *(state->path) = 0;
        }
    else
#endif
        (void)snprintf(state->path, len + 1, "%s", (const char *)path);

    /* compute the flags for open() */
    oflag =
#ifdef O_LARGEFILE
        O_LARGEFILE |
#endif
#ifdef O_BINARY
        O_BINARY |
#endif
#ifdef O_CLOEXEC
        (cloexec ? O_CLOEXEC : 0) |
#endif
        (state->mode == GZ_READ ?
         O_RDONLY :
         (O_WRONLY | O_CREAT |
#ifdef O_EXCL
          (exclusive ? O_EXCL : 0) |
#endif
          (state->mode == GZ_WRITE ?
           O_TRUNC :
           O_APPEND)));

    /* open the file with the appropriate flags (or just use fd) */
    state->fd = fd > -1 ? fd : (
#if defined(_WIN32)
        fd == -2 ? _wopen((const wchar_t *)path, oflag, 0666) :
#elif __CYGWIN__
        fd == -2 ? open(state->path, oflag, 0666) :
#endif
        open((const char *)path, oflag, 0666));
    if (state->fd == -1) {
        free(state->path);
        zng_free(state);
        return NULL;
    }
    if (state->mode == GZ_APPEND) {
        LSEEK(state->fd, 0, SEEK_END);  /* so gzoffset() is correct */
        state->mode = GZ_WRITE;         /* simplify later checks */
    }

    /* save the current position for rewinding (only if reading) */
    if (state->mode == GZ_READ) {
        state->start = LSEEK(state->fd, 0, SEEK_CUR);
        if (state->start == -1) state->start = 0;
    }

    /* initialize stream */
    gz_reset(state);

    /* return stream */
    return (gzFile)state;
}